

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

void __thiscall
cmListFileBacktrace::cmListFileBacktrace(cmListFileBacktrace *this,cmListFileBacktrace *r)

{
  uint *puVar1;
  Entry *pEVar2;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar3;
  bool bVar4;
  
  (this->Bottom).Position.Position = (r->Bottom).Position.Position;
  pcVar3 = (r->Bottom).Position.Tree;
  (this->Bottom).State = (r->Bottom).State;
  (this->Bottom).Position.Tree = pcVar3;
  pEVar2 = r->Cur;
  this->Cur = pEVar2;
  if (pEVar2 != (Entry *)0x0) {
    bVar4 = cmStateSnapshot::IsValid(&this->Bottom);
    if (!bVar4) {
      __assert_fail("this->Bottom.IsValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmListFileCache.cxx"
                    ,0x15c,"cmListFileBacktrace::cmListFileBacktrace(const cmListFileBacktrace &)");
    }
    puVar1 = &this->Cur->RefCount;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

cmListFileBacktrace::cmListFileBacktrace(cmListFileBacktrace const& r)
  : Bottom(r.Bottom)
  , Cur(r.Cur)
{
  if (this->Cur) {
    assert(this->Bottom.IsValid());
    this->Cur->Ref();
  }
}